

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O0

void __thiscall
Spaghetti<TTA>::PerformLabelingMem
          (Spaghetti<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  uint uVar4;
  uchar *puVar5;
  uint *puVar6;
  int *piVar7;
  reference pvVar8;
  double dVar9;
  Mat_<int> local_2e0;
  allocator<unsigned_long> local_279;
  value_type_conflict2 local_278;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_270;
  uint local_254;
  int local_250;
  int iLabel;
  int c_4;
  int r_4;
  int c_3;
  int r_3;
  int c_2;
  int r_2;
  int c_1;
  int r_1;
  int c;
  int r;
  undefined1 local_220 [8];
  MemMat<int> img_labels;
  Mat_<unsigned_char> local_148;
  undefined1 local_e8 [8];
  MemMat<unsigned_char> img;
  int w;
  int h;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  Spaghetti<TTA> *this_local;
  
  img.accesses_._92_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  img.accesses_._88_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  TTA::MemAlloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) * ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1)
                + 1);
  TTA::MemSetup();
  cv::Mat_<unsigned_char>::Mat_(&local_148,(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_e8,&local_148);
  cv::Mat_<unsigned_char>::~Mat_(&local_148);
  cv::MatSize::operator()((MatSize *)&c);
  MemMat<int>::MemMat((MemMat<int> *)local_220,(Size *)&c,0);
  if (img.accesses_._92_4_ == 1) {
    r_1 = 0;
    c_1 = -2;
LAB_001a18ce:
    c_1 = c_1 + 2;
    if (c_1 < img.accesses_._88_4_ + -2) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
      if (*puVar5 == '\0') goto LAB_001a1a1e;
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
      if (*puVar5 == '\0') {
        uVar4 = TTA::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *puVar6 = uVar4;
      }
      else {
        uVar4 = TTA::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *puVar6 = uVar4;
        while( true ) {
          while( true ) {
            c_1 = c_1 + 2;
            if (img.accesses_._88_4_ + -2 <= c_1) {
              if (img.accesses_._88_4_ + -2 < c_1) {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar7 = 0;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar7 = iVar1;
                }
              }
              else {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1);
                if (*puVar5 == '\0') goto LAB_001a1db3;
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar7 = iVar1;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar7 = iVar1;
                }
              }
              goto LAB_001af423;
            }
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
            if (*puVar5 == '\0') break;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar7 = iVar1;
              goto LAB_001a18ce;
            }
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar7 = iVar1;
          }
LAB_001a1a1e:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
          if (*puVar5 == '\0') break;
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar6 = uVar4;
        }
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *piVar7 = 0;
      }
      goto LAB_001a18ce;
    }
    if (img.accesses_._88_4_ + -2 < c_1) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
      if (*puVar5 == '\0') {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *piVar7 = 0;
      }
      else {
        uVar4 = TTA::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *puVar6 = uVar4;
      }
    }
    else {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
      if (*puVar5 == '\0') {
LAB_001a1db3:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
        if (*puVar5 == '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *piVar7 = 0;
        }
        else {
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar6 = uVar4;
        }
      }
      else {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1);
        if (*puVar5 == '\0') {
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar6 = uVar4;
        }
        else {
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar6 = uVar4;
        }
      }
    }
  }
  else {
    r_2 = 0;
    c_2 = -2;
LAB_001a1f49:
    c_2 = c_2 + 2;
    if (c_2 < img.accesses_._88_4_ + -2) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
      if ((*puVar5 == '\0') &&
         (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2),
         *puVar5 == '\0')) goto LAB_001a2081;
LAB_001a1fb2:
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
      if (*puVar5 == '\0') {
        uVar4 = TTA::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
        *puVar6 = uVar4;
        goto LAB_001a22cf;
      }
      uVar4 = TTA::MemNewLabel();
      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
      *puVar6 = uVar4;
LAB_001a216b:
      do {
        c_2 = c_2 + 2;
        if (img.accesses_._88_4_ + -2 <= c_2) {
          if (img.accesses_._88_4_ + -2 < c_2) {
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                *piVar7 = 0;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                *piVar7 = iVar1;
              }
            }
            else {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
              *piVar7 = iVar1;
            }
            goto LAB_001a2c79;
          }
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
          if ((*puVar5 == '\0') &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2), *puVar5 == '\0'))
          goto LAB_001a2975;
LAB_001a2a9b:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *piVar7 = iVar1;
          }
          else {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *piVar7 = iVar1;
          }
          goto LAB_001a2c79;
        }
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
        if ((*puVar5 == '\0') &&
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2), *puVar5 == '\0')) {
LAB_001a2081:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
          if (*puVar5 == '\0') {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + 1);
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
              *piVar7 = 0;
              goto LAB_001a1f49;
            }
            uVar4 = TTA::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *puVar6 = uVar4;
          }
          else {
            uVar4 = TTA::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *puVar6 = uVar4;
          }
        }
        else {
          while (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1), *puVar5 == '\0'
                ) {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *piVar7 = iVar1;
LAB_001a22cf:
            while( true ) {
              c_2 = c_2 + 2;
              if (img.accesses_._88_4_ + -2 <= c_2) {
                if (img.accesses_._88_4_ + -2 < c_2) {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_2,c_2);
                  if ((*puVar5 == '\0') &&
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2),
                     *puVar5 == '\0')) {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                    *piVar7 = 0;
                    goto LAB_001a2c79;
                  }
                }
                else {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_2,c_2);
                  if (*puVar5 != '\0') {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
                    if (*puVar5 == '\0') goto LAB_001a28a9;
                    goto LAB_001a2a9b;
                  }
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2);
                  if (*puVar5 == '\0') goto LAB_001a2975;
                  MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
                if (*puVar5 == '\0') {
                  uVar4 = TTA::MemNewLabel();
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                  *puVar6 = uVar4;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                  *piVar7 = iVar1;
                }
                goto LAB_001a2c79;
              }
              puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
              if (*puVar5 != '\0') break;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2);
              if (*puVar5 == '\0') goto LAB_001a2081;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
              if (*puVar5 != '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
                if (*puVar5 == '\0') {
                  uVar4 = TTA::MemNewLabel();
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                  *puVar6 = uVar4;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                  *piVar7 = iVar1;
                }
                goto LAB_001a216b;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
              if (*puVar5 == '\0') {
                uVar4 = TTA::MemNewLabel();
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                *puVar6 = uVar4;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
                *piVar7 = iVar1;
              }
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + -1);
            if (*puVar5 == '\0') goto LAB_001a1fb2;
          }
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2 + -2);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *piVar7 = iVar1;
        }
      } while( true );
    }
    if (img.accesses_._88_4_ + -2 < c_2) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
      if (*puVar5 == '\0') {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2);
        if (*puVar5 == '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *piVar7 = 0;
        }
        else {
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *puVar6 = uVar4;
        }
      }
      else {
        uVar4 = TTA::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
        *puVar6 = uVar4;
      }
    }
    else {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2);
      if ((*puVar5 == '\0') &&
         (puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2),
         *puVar5 == '\0')) {
LAB_001a2975:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
        if (*puVar5 == '\0') {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,r_2 + 1,c_2 + 1);
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *piVar7 = 0;
          }
          else {
            uVar4 = TTA::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
            *puVar6 = uVar4;
          }
        }
        else {
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *puVar6 = uVar4;
        }
      }
      else {
LAB_001a28a9:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_2,c_2 + 1);
        if (*puVar5 == '\0') {
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *puVar6 = uVar4;
        }
        else {
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_2,c_2);
          *puVar6 = uVar4;
        }
      }
    }
LAB_001a2c79:
    for (r_3 = 2; r_3 < img.accesses_._92_4_ - (int)img.accesses_._92_4_ % 2; r_3 = r_3 + 2) {
      c_3 = 0;
      if (0 < img.accesses_._88_4_ + -2) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,0);
        if (*puVar5 == '\0') {
LAB_001a30ec:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
          if (*puVar5 == '\0') goto LAB_001a320f;
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
          if (*puVar5 != '\0') goto LAB_001a315a;
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *puVar6 = uVar4;
          goto LAB_001a657c;
        }
LAB_001a2d20:
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
        if (*puVar5 == '\0') {
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
          if (*puVar5 != '\0') goto LAB_001a2dd4;
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3)
          ;
          if (*puVar5 == '\0') {
            uVar4 = TTA::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *puVar6 = uVar4;
            goto LAB_001a6f1e;
          }
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *piVar7 = iVar1;
          goto LAB_001a70b6;
        }
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
        iVar1 = *piVar7;
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
        *piVar7 = iVar1;
LAB_001a7a7f:
        do {
          c_3 = c_3 + 2;
          if (img.accesses_._88_4_ + -2 <= c_3) {
            if (img.accesses_._88_4_ + -2 < c_3) {
              puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3);
              if (*puVar5 == '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = 0;
                }
                else {
LAB_001a960b:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                  if (*puVar5 == '\0') {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
                    if (*puVar5 == '\0') {
                      uVar4 = TTA::MemNewLabel();
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                }
              }
              else {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
                if (*puVar5 == '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                  if (*puVar5 == '\0') {
LAB_001a950d:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
              }
              goto LAB_001ab6d8;
            }
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
              if (*puVar5 == '\0') goto LAB_001a9a5e;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
              if (*puVar5 == '\0') goto LAB_001a960b;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
              if (*puVar5 != '\0') goto LAB_001aa99b;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
              if (*puVar5 == '\0') goto LAB_001a993c;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
              if (*puVar5 == '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                goto LAB_001ab6d8;
              }
            }
            else {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
              if ((*puVar5 == '\0') &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1),
                 *puVar5 == '\0')) {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                if (*puVar5 == '\0') goto LAB_001a950d;
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                if (*puVar5 == '\0') {
LAB_001a9c45:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
                  if (*puVar5 == '\0') {
                    puVar6 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                    uVar4 = *puVar6;
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *puVar6 = uVar4;
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                }
                else {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                goto LAB_001ab6d8;
              }
LAB_001aa99b:
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_001ab6d8;
              }
            }
LAB_001aa9d5:
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
              if (*puVar5 == '\0') {
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                uVar4 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
              }
            }
            else {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
            }
            goto LAB_001ab6d8;
          }
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3);
          if (*puVar5 == '\0') {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
            if (*puVar5 == '\0') goto LAB_001a320f;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
              if (*puVar5 != '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_001a657c;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
              if (*puVar5 == '\0') {
                uVar4 = TTA::MemNewLabel();
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
                goto LAB_001a657c;
              }
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
              goto LAB_001a657c;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1);
            if (*puVar5 != '\0') goto LAB_001a637f;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
            if (*puVar5 == '\0') goto LAB_001a315a;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
            if (*puVar5 != '\0') goto LAB_001a63b9;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
            if (*puVar5 != '\0') goto LAB_001a6047;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
            if (*puVar5 != '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
              goto LAB_001a4ff3;
            }
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *piVar7 = iVar1;
LAB_001a4a7f:
            do {
              c_3 = c_3 + 2;
              if (img.accesses_._88_4_ + -2 <= c_3) {
                if (img.accesses_._88_4_ + -2 < c_3) {
LAB_001a8f88:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                  if (*puVar5 == '\0') {
LAB_001a8eec:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = 0;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                  goto LAB_001ab6d8;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                if (*puVar5 == '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                  if (*puVar5 == '\0') {
LAB_001aa42b:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                    if (*puVar5 == '\0') goto LAB_001a9a97;
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                    if (*puVar5 == '\0') {
                      uVar4 = TTA::MemNewLabel();
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                    goto LAB_001ab6d8;
                  }
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                    goto LAB_001ab6d8;
                  }
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                else {
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *puVar6 = uVar4;
                }
                goto LAB_001ab6d8;
              }
              puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3);
              if (*puVar5 != '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                if (*puVar5 == '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                    goto LAB_001a817c;
                  }
LAB_001a4bd1:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                    goto LAB_001a677a;
                  }
                  puVar6 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *puVar6 = uVar4;
                  goto LAB_001a5869;
                }
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                uVar4 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
                goto LAB_001a7a7f;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
              if (*puVar5 != '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                  goto LAB_001a657c;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                if (*puVar5 != '\0') {
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *puVar6 = uVar4;
                  goto LAB_001a5dbd;
                }
                goto LAB_001a4bd1;
              }
LAB_001a4e8a:
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
              if (*puVar5 == '\0') {
LAB_001a3248:
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + 1);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = 0;
                  c_3 = c_3 + 2;
                  if (c_3 < img.accesses_._88_4_ + -2) {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                    if (*puVar5 == '\0') goto LAB_001a30ec;
LAB_001a3335:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                    if (*puVar5 != '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                      if (*puVar5 == '\0') {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                        if (*puVar5 != '\0') goto LAB_001a3421;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                      }
                      goto LAB_001a7a7f;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                    if (*puVar5 == '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                      if (*puVar5 == '\0') {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                        if (*puVar5 == '\0') {
                          uVar4 = TTA::MemNewLabel();
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_001a6f1e;
                        }
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2)
                        ;
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                        goto LAB_001a6f1e;
                      }
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
LAB_001a70b6:
                      do {
                        c_3 = c_3 + 2;
                        if (img.accesses_._88_4_ + -2 <= c_3) {
                          if (img.accesses_._88_4_ + -2 < c_3) {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                            if (*puVar5 == '\0') {
LAB_001a9077:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = 0;
                              }
                              else {
LAB_001a90af:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + 1,
                                                    c_3 + -1);
                                if (*puVar5 == '\0') {
                                  uVar4 = TTA::MemNewLabel();
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                  *puVar6 = uVar4;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                              }
                              goto LAB_001ab6d8;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                            if (*puVar5 == '\0') goto LAB_001a8a68;
                          }
                          else {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                            if (*puVar5 == '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                              if (*puVar5 == '\0') goto LAB_001a9a5e;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                              if (*puVar5 == '\0') goto LAB_001a90af;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                            if (*puVar5 == '\0') goto LAB_001a993c;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                            if (*puVar5 != '\0') {
LAB_001ab06b:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,
                                                  c_3 + -1);
                              if (*puVar5 != '\0') goto LAB_001aa9d5;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3 + -2,c_3);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                              *puVar6 = uVar4;
                              goto LAB_001ab6d8;
                            }
                          }
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                          if (*puVar5 == '\0') {
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                            iVar1 = *piVar7;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                            *piVar7 = iVar1;
                          }
                          else {
LAB_001a9295:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1)
                            ;
                            if (*puVar5 == '\0') {
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3 + -2,c_3);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                              *puVar6 = uVar4;
                            }
                            else {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3 + -2,c_3);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                            }
                          }
                          goto LAB_001ab6d8;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                        if (*puVar5 == '\0') {
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                          if (*puVar5 == '\0') goto LAB_001a320f;
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                          if (*puVar5 == '\0') goto LAB_001a66c7;
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                          if (*puVar5 == '\0') goto LAB_001a315a;
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                          if (*puVar5 != '\0') {
LAB_001a79b2:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1)
                            ;
                            if (*puVar5 != '\0') goto LAB_001a63b9;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3);
                            uVar4 = *puVar6;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                            *puVar6 = uVar4;
LAB_001a5dbd:
                            c_3 = c_3 + 2;
                            if (img.accesses_._88_4_ + -2 <= c_3) {
                              if (img.accesses_._88_4_ + -2 < c_3) goto LAB_001a8f88;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                              if (*puVar5 != '\0') goto LAB_001aa99b;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                              if (*puVar5 == '\0') goto LAB_001a9a5e;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                              if (*puVar5 != '\0') goto LAB_001aa99b;
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                              goto LAB_001ab6d8;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                            if (*puVar5 == '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                              if (*puVar5 == '\0') goto LAB_001a320f;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = iVar1;
                                goto LAB_001a657c;
                              }
LAB_001a637f:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1
                                                 );
                              if (*puVar5 != '\0') {
LAB_001a63b9:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3
                                                     );
                                  if (*puVar5 == '\0') {
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3 + -2,
                                                                c_3);
                                    uVar4 = *puVar6;
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3,
                                                                c_3 + -2);
                                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3,c_3);
                                    *puVar6 = uVar4;
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                  }
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                                goto LAB_001a5dbd;
                              }
                            }
                            else {
LAB_001a5e26:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1
                                                 );
                              if (*puVar5 != '\0') goto LAB_001a5e60;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = iVar1;
                                goto LAB_001a817c;
                              }
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
                            if (*puVar5 == '\0') {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                              goto LAB_001a677a;
                            }
LAB_001a6047:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + 1);
                            if (*puVar5 == '\0') {
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2)
                              ;
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                              *puVar6 = uVar4;
                              goto LAB_001a5869;
                            }
LAB_001a6082:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                            if (*puVar5 == '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
                              if (*puVar5 == '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3 + -2,
                                                            c_3 + 2);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3);
                                *puVar6 = uVar4;
                              }
                              else {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = iVar1;
                              }
                            }
                            else {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                            }
LAB_001a5869:
                            do {
                              c_3 = c_3 + 2;
                              if (img.accesses_._88_4_ + -2 <= c_3) {
                                if (img.accesses_._88_4_ + -2 < c_3) goto LAB_001a8f88;
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3)
                                  ;
                                  if (*puVar5 == '\0') {
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3,
                                                        c_3 + 1);
                                    if (*puVar5 == '\0') goto LAB_001a9a97;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                    goto LAB_001ab6d8;
                                  }
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1)
                                  ;
                                  if (*puVar5 == '\0') {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                    goto LAB_001ab6d8;
                                  }
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 1);
                                if (*puVar5 == '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                                goto LAB_001ab6d8;
                              }
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                              if (*puVar5 == '\0') {
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                                if (*puVar5 != '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1)
                                  ;
                                  if (*puVar5 == '\0') {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                    goto LAB_001a657c;
                                  }
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                      c_3 + 1);
                                  if (*puVar5 == '\0') goto LAB_001a5984;
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_001a5dbd;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                                if (*puVar5 == '\0') goto LAB_001a3248;
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 1);
                                if (*puVar5 != '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_001a5dbd;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 2);
                                if (*puVar5 == '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_001a4ff3;
                                }
LAB_001a2e45:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -2,
                                                    c_3 + 1);
                                if (*puVar5 == '\0') {
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3 + -2,c_3)
                                  ;
                                  uVar4 = *puVar6;
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3 + -2,
                                                              c_3 + 2);
                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                  *puVar6 = uVar4;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                              }
                              else {
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 1);
                                if (*puVar5 != '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_001a7a7f;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                                if (*puVar5 == '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                  goto LAB_001a817c;
                                }
LAB_001a5984:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                    c_3 + 2);
                                if (*puVar5 == '\0') {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
LAB_001a677a:
                                  do {
                                    c_3 = c_3 + 2;
                                    if (img.accesses_._88_4_ + -2 <= c_3) {
                                      if (img.accesses_._88_4_ + -2 < c_3) goto LAB_001a8f88;
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3,c_3)
                                      ;
                                      if (*puVar5 == '\0') {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + 1,c_3);
                                        if (*puVar5 == '\0') goto LAB_001aa42b;
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,r_3,
                                                            c_3 + 1);
                                        if (*puVar5 == '\0') {
                                          piVar7 = MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3 + -2)
                                          ;
                                          iVar1 = *piVar7;
                                          piVar7 = MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                          *piVar7 = iVar1;
                                          goto LAB_001ab6d8;
                                        }
                                      }
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1
                                                          ,c_3 + 1);
                                      if (*puVar5 == '\0') {
                                        piVar7 = MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                        iVar1 = *piVar7;
                                        piVar7 = MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3);
                                        *piVar7 = iVar1;
                                      }
                                      else {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -2,c_3);
                                        if (*puVar5 != '\0') goto LAB_001a97fa;
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,
                                                                    r_3 + -2,c_3);
                                        uVar4 = *puVar6;
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                        uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                        *puVar6 = uVar4;
                                      }
                                      goto LAB_001ab6d8;
                                    }
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                                    if (*puVar5 != '\0') {
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1
                                                          ,c_3 + 1);
                                      if (*puVar5 != '\0') {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -2,c_3);
                                        if (*puVar5 == '\0') {
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                        }
                                        else {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + -2);
                                          if (*puVar5 == '\0') {
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                          }
                                          else {
LAB_001a50cb:
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -2,c_3 + -1);
                                            if (*puVar5 == '\0') {
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            else {
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3 + -2,
                                                                  c_3);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
                                            }
                                          }
                                        }
                                        goto LAB_001a7a7f;
                                      }
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3,
                                                          c_3 + 1);
                                      if (*puVar5 != '\0') goto LAB_001a69c0;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                                      *piVar7 = iVar1;
LAB_001a817c:
                                      c_3 = c_3 + 2;
                                      if (c_3 < img.accesses_._88_4_ + -2) {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,r_3,
                                                            c_3);
                                        if (*puVar5 == '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + 1,c_3);
                                          if (*puVar5 == '\0') goto LAB_001a320f;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,r_3,
                                                              c_3 + 1);
                                          if (*puVar5 == '\0') goto LAB_001a66c7;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + 1,c_3 + -1);
                                          if (*puVar5 == '\0') goto LAB_001a315a;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + 1);
                                          if (*puVar5 != '\0') {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 != '\0') goto LAB_001a79b2;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                            goto LAB_001a5dbd;
                                          }
                                        }
                                        else {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + 1,c_3 + -1);
                                          if (*puVar5 == '\0') goto LAB_001a2d20;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + 1);
                                          if (*puVar5 != '\0') {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 != '\0') goto LAB_001a718f;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                            goto LAB_001a7a7f;
                                          }
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,r_3,
                                                              c_3 + 1);
                                          if (*puVar5 == '\0') {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3);
                                            if (*puVar5 == '\0') {
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,
                                                                  c_3 + -2);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
                                              goto LAB_001a6f1e;
                                            }
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 != '\0') goto LAB_001a778b;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                            goto LAB_001a70b6;
                                          }
                                        }
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -1,c_3 + 2);
                                        if (*puVar5 == '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3);
                                          if (*puVar5 != '\0') {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 == '\0') {
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            else {
LAB_001a760f:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -2,c_3 + -1);
                                              if (*puVar5 == '\0') {
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                              }
                                              else {
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,
                                                                    r_3 + -2,c_3);
                                                iVar1 = *piVar7;
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                                *piVar7 = iVar1;
                                              }
                                            }
LAB_001a4ff3:
                                            while (c_3 = c_3 + 2, c_3 < img.accesses_._88_4_ + -2) {
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3);
                                              if (*puVar5 != '\0') {
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + 1);
                                                if (*puVar5 != '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -2,c_3);
                                                  if (*puVar5 != '\0') goto LAB_001a50cb;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,c_3
                                                                             );
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                  goto LAB_001a7a7f;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3,c_3 + 1);
                                                if (*puVar5 == '\0') {
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                                  iVar1 = *piVar7;
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                                  *piVar7 = iVar1;
                                                  goto LAB_001a817c;
                                                }
LAB_001a527e:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + 2);
                                                if (*puVar5 == '\0') {
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                                  iVar1 = *piVar7;
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                                  *piVar7 = iVar1;
                                                  goto LAB_001a677a;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -2,c_3 + 1);
                                                if (*puVar5 == '\0') {
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + 2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                }
                                                else {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -2,c_3);
                                                  if (*puVar5 != '\0') goto LAB_001a5329;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + 2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                }
                                                goto LAB_001a5869;
                                              }
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + 1,c_3);
                                              if (*puVar5 == '\0') goto LAB_001a4e8a;
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3 + 1);
                                              if (*puVar5 != '\0') {
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + 1);
                                                if (*puVar5 == '\0') goto LAB_001a527e;
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -2,c_3);
                                                if (*puVar5 != '\0') goto LAB_001a569c;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                                goto LAB_001a5dbd;
                                              }
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,
                                                                  c_3 + -2);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
LAB_001a657c:
                                              c_3 = c_3 + 2;
                                              if (img.accesses_._88_4_ + -2 <= c_3) {
                                                if (img.accesses_._88_4_ + -2 < c_3) {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3,c_3);
                                                  if (*puVar5 == '\0') goto LAB_001a9077;
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + 1,c_3 + -1);
                                                  if (*puVar5 != '\0') goto LAB_001a8d36;
                                                  goto LAB_001a8bcf;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3,c_3);
                                                if (*puVar5 != '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + 1,c_3 + -1);
                                                  if (*puVar5 != '\0') goto LAB_001a9dca;
                                                  goto LAB_001a9b59;
                                                }
LAB_001aacb7:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + 1,c_3);
                                                if (*puVar5 == '\0') goto LAB_001a9a5e;
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3,c_3 + 1);
                                                if (*puVar5 == '\0') goto LAB_001a90af;
LAB_001aad1d:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + 1,c_3 + -1);
                                                if (*puVar5 != '\0') goto LAB_001aa142;
                                                goto LAB_001a993c;
                                              }
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3);
                                              if (*puVar5 != '\0') {
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + 1,c_3 + -1);
                                                if (*puVar5 == '\0') goto LAB_001a3335;
LAB_001a3b16:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + 1);
                                                if (*puVar5 != '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3);
                                                  if (*puVar5 == '\0') {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -1,c_3 + -1);
                                                    if (*puVar5 == '\0') {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                    else {
                                                      puVar5 = MemMat<unsigned_char>::operator()
                                                                         ((MemMat<unsigned_char> *)
                                                                          local_e8,r_3 + -2,c_3);
                                                      if (*puVar5 == '\0') {
                                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                                   ((MemMat<int> *)
                                                                                    local_220,
                                                                                    r_3 + -2,c_3 + 
                                                  -2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,c_3
                                                                             );
                                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                  }
                                                  else {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                  }
                                                  goto LAB_001a7a7f;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3,c_3 + 1);
                                                if (*puVar5 != '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3 + 2);
                                                  if (*puVar5 == '\0') {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -1,c_3 + -1);
                                                    if (*puVar5 == '\0') goto LAB_001a43fe;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3 + -2);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                    goto LAB_001a677a;
                                                  }
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3);
                                                  if (*puVar5 == '\0') {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -1,c_3 + -1);
                                                    if (*puVar5 == '\0') {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                    else {
                                                      puVar5 = MemMat<unsigned_char>::operator()
                                                                         ((MemMat<unsigned_char> *)
                                                                          local_e8,r_3 + -2,c_3 + 1)
                                                      ;
                                                      if (*puVar5 == '\0') {
                                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                                   ((MemMat<int> *)
                                                                                    local_220,
                                                                                    r_3 + -2,c_3 + 
                                                  -2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + 2);
                                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                  }
                                                  else {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -2,c_3);
                                                    if (*puVar5 == '\0') {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + -2);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                    else {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + -2,c_3 + 1);
                                                    if (*puVar5 == '\0') {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                    else {
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3 + -2
                                                                                  ,c_3 + 2);
                                                      uVar4 = *puVar6;
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,
                                                                                  c_3 + -2);
                                                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                                 ((MemMat<int> *)
                                                                                  local_220,r_3,c_3)
                                                      ;
                                                      *puVar6 = uVar4;
                                                    }
                                                  }
                                                  goto LAB_001a5869;
                                                }
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -1,c_3 + -1);
                                                if (*puVar5 != '\0') {
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + -2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                  goto LAB_001a817c;
                                                }
                                                while( true ) {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3);
                                                  if (*puVar5 != '\0') {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                    goto LAB_001a70b6;
                                                  }
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                                  iVar1 = *piVar7;
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                                  *piVar7 = iVar1;
LAB_001a6f1e:
                                                  c_3 = c_3 + 2;
                                                  if (img.accesses_._88_4_ + -2 <= c_3) {
                                                    if (c_3 <= img.accesses_._88_4_ + -2) {
                                                      puVar5 = MemMat<unsigned_char>::operator()
                                                                         ((MemMat<unsigned_char> *)
                                                                          local_e8,r_3,c_3);
                                                      if (*puVar5 == '\0') goto LAB_001aacb7;
                                                      goto LAB_001aad1d;
                                                    }
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3,c_3);
                                                    if (*puVar5 == '\0') goto LAB_001a9077;
                                                    puVar5 = MemMat<unsigned_char>::operator()
                                                                       ((MemMat<unsigned_char> *)
                                                                        local_e8,r_3 + 1,c_3 + -1);
                                                    if (*puVar5 == '\0') goto LAB_001a8a68;
                                                    goto LAB_001a8df2;
                                                  }
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3,c_3);
                                                  if (*puVar5 == '\0') break;
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + 1,c_3 + -1);
                                                  if (*puVar5 == '\0') goto LAB_001a2d20;
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3 + 1);
                                                  if (*puVar5 != '\0') {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                    goto LAB_001a7a7f;
                                                  }
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3,c_3 + 1);
                                                  if (*puVar5 != '\0') goto LAB_001a47cf;
                                                }
                                              }
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + 1,c_3);
                                              if (*puVar5 == '\0') goto LAB_001a320f;
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3 + 1);
                                              if (*puVar5 == '\0') {
LAB_001a66c7:
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + 1,c_3 + -1);
                                                if (*puVar5 == '\0') {
                                                  uVar4 = TTA::MemNewLabel();
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                }
                                                else {
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                                  iVar1 = *piVar7;
                                                  piVar7 = MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                                  *piVar7 = iVar1;
                                                }
                                                goto LAB_001a657c;
                                              }
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + 1,c_3 + -1);
                                              if (*puVar5 == '\0') goto LAB_001a315a;
LAB_001a471a:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -1,c_3 + 1);
                                              if (*puVar5 != '\0') {
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                                goto LAB_001a5dbd;
                                              }
LAB_001a47cf:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -1,c_3 + 2);
                                              if (*puVar5 != '\0') {
                                                puVar5 = MemMat<unsigned_char>::operator()
                                                                   ((MemMat<unsigned_char> *)
                                                                    local_e8,r_3 + -2,c_3 + 1);
                                                if (*puVar5 == '\0') {
                                                  puVar5 = MemMat<unsigned_char>::operator()
                                                                     ((MemMat<unsigned_char> *)
                                                                      local_e8,r_3 + -1,c_3);
                                                  if (*puVar5 == '\0') {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3 + 2);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                  }
                                                  else {
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3);
                                                    uVar4 = *puVar6;
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3 + -2,
                                                                                c_3 + 2);
                                                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,
                                                                                c_3 + -2);
                                                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                    puVar6 = (uint *)MemMat<int>::operator()
                                                                               ((MemMat<int> *)
                                                                                local_220,r_3,c_3);
                                                    *puVar6 = uVar4;
                                                  }
                                                }
                                                else {
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3 + -2,
                                                                              c_3 + 2);
                                                  uVar4 = *puVar6;
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3 + -2
                                                                             );
                                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                  puVar6 = (uint *)MemMat<int>::operator()
                                                                             ((MemMat<int> *)
                                                                              local_220,r_3,c_3);
                                                  *puVar6 = uVar4;
                                                }
                                                goto LAB_001a5869;
                                              }
LAB_001a43fe:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -1,c_3);
                                              if (*puVar5 == '\0') {
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                                iVar1 = *piVar7;
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                                *piVar7 = iVar1;
                                                goto LAB_001a4a7f;
                                              }
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            if (img.accesses_._88_4_ + -2 < c_3) goto LAB_001a8f88;
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3,c_3);
                                            if (*puVar5 == '\0') {
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + 1,c_3);
                                              if (*puVar5 == '\0') goto LAB_001aa42b;
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3,c_3 + 1);
                                              if (*puVar5 == '\0') {
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                                iVar1 = *piVar7;
                                                piVar7 = MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                                *piVar7 = iVar1;
                                                goto LAB_001ab6d8;
                                              }
                                            }
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + 1);
                                            if (*puVar5 == '\0') {
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,
                                                                  c_3 + -2);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
                                            }
                                            else {
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -2,c_3);
                                              if (*puVar5 != '\0') goto LAB_001a9295;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            goto LAB_001ab6d8;
                                          }
                                          piVar7 = MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3 + -2)
                                          ;
                                          iVar1 = *piVar7;
                                          piVar7 = MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                          *piVar7 = iVar1;
                                          goto LAB_001a4a7f;
                                        }
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -2,c_3 + 1);
                                        if (*puVar5 == '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3);
                                          if (*puVar5 == '\0') {
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3 + 2);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                          }
                                          else {
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -1,c_3 + -2);
                                            if (*puVar5 == '\0') {
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3 + 2);
                                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            else {
LAB_001a73e8:
                                              puVar5 = MemMat<unsigned_char>::operator()
                                                                 ((MemMat<unsigned_char> *)local_e8,
                                                                  r_3 + -2,c_3 + -1);
                                              if (*puVar5 == '\0') {
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3 + 2);
                                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                              }
                                              else {
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3 + -2,c_3 + 2);
                                                uVar4 = *puVar6;
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3 + -2);
                                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                                puVar6 = (uint *)MemMat<int>::operator()
                                                                           ((MemMat<int> *)local_220
                                                                            ,r_3,c_3);
                                                *puVar6 = uVar4;
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + -2);
                                          if (*puVar5 != '\0') goto LAB_001a72f4;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3 + 2);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                        }
                                        goto LAB_001a5869;
                                      }
                                      if (img.accesses_._88_4_ + -2 < c_3) {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,r_3,
                                                            c_3);
                                        if (*puVar5 == '\0') goto LAB_001a9077;
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + 1,c_3 + -1);
                                        if (*puVar5 == '\0') goto LAB_001a8a68;
                                      }
                                      else {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,r_3,
                                                            c_3);
                                        if (*puVar5 == '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + 1,c_3);
                                          if (*puVar5 == '\0') goto LAB_001a9a5e;
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,r_3,
                                                              c_3 + 1);
                                          if (*puVar5 == '\0') goto LAB_001a90af;
                                        }
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + 1,c_3 + -1);
                                        if (*puVar5 == '\0') goto LAB_001a993c;
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -1,c_3 + 1);
                                        if (*puVar5 != '\0') {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + -2);
                                          if (*puVar5 != '\0') goto LAB_001ab06b;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                          goto LAB_001ab6d8;
                                        }
                                      }
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1
                                                          ,c_3);
                                      if (*puVar5 == '\0') {
                                        piVar7 = MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                        iVar1 = *piVar7;
                                        piVar7 = MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3);
                                        *piVar7 = iVar1;
                                        goto LAB_001ab6d8;
                                      }
LAB_001a97fa:
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1
                                                          ,c_3 + -2);
                                      if (*puVar5 != '\0') goto LAB_001a9295;
                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3 + -2,
                                                                  c_3);
                                      uVar4 = *puVar6;
                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,
                                                                  c_3 + -2);
                                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                      *puVar6 = uVar4;
                                      goto LAB_001ab6d8;
                                    }
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3 + 1,
                                                        c_3);
                                    if (*puVar5 == '\0') goto LAB_001a4e8a;
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3,
                                                        c_3 + 1);
                                    if (*puVar5 == '\0') {
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_3,c_3);
                                      *piVar7 = iVar1;
                                      goto LAB_001a657c;
                                    }
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                        c_3 + 1);
                                    if (*puVar5 != '\0') {
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -2
                                                          ,c_3);
                                      if (*puVar5 == '\0') {
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,
                                                                    r_3 + -2,c_3);
                                        uVar4 = *puVar6;
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                        uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                        *puVar6 = uVar4;
                                      }
                                      else {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -1,c_3 + -2);
                                        if (*puVar5 == '\0') {
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                        }
                                        else {
LAB_001a569c:
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -2,c_3 + -1);
                                          if (*puVar5 == '\0') {
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                          }
                                          else {
                                            piVar7 = MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3 + -2,
                                                                c_3);
                                            iVar1 = *piVar7;
                                            piVar7 = MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_3,c_3);
                                            *piVar7 = iVar1;
                                          }
                                        }
                                      }
                                      goto LAB_001a5dbd;
                                    }
LAB_001a69c0:
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,
                                                        c_3 + 2);
                                    if (*puVar5 != '\0') {
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -2
                                                          ,c_3 + 1);
                                      if (*puVar5 == '\0') {
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,
                                                                    r_3 + -2,c_3 + 2);
                                        uVar4 = *puVar6;
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,
                                                                    c_3 + -2);
                                        uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                        puVar6 = (uint *)MemMat<int>::operator()
                                                                   ((MemMat<int> *)local_220,r_3,c_3
                                                                   );
                                        *puVar6 = uVar4;
                                      }
                                      else {
                                        puVar5 = MemMat<unsigned_char>::operator()
                                                           ((MemMat<unsigned_char> *)local_e8,
                                                            r_3 + -2,c_3);
                                        if (*puVar5 == '\0') {
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,
                                                                      r_3 + -2,c_3 + 2);
                                          uVar4 = *puVar6;
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3 + -2);
                                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                          puVar6 = (uint *)MemMat<int>::operator()
                                                                     ((MemMat<int> *)local_220,r_3,
                                                                      c_3);
                                          *puVar6 = uVar4;
                                        }
                                        else {
                                          puVar5 = MemMat<unsigned_char>::operator()
                                                             ((MemMat<unsigned_char> *)local_e8,
                                                              r_3 + -1,c_3 + -2);
                                          if (*puVar5 == '\0') {
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,
                                                                        r_3 + -2,c_3 + 2);
                                            uVar4 = *puVar6;
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3 + -2);
                                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                            puVar6 = (uint *)MemMat<int>::operator()
                                                                       ((MemMat<int> *)local_220,r_3
                                                                        ,c_3);
                                            *puVar6 = uVar4;
                                          }
                                          else {
LAB_001a5329:
                                            puVar5 = MemMat<unsigned_char>::operator()
                                                               ((MemMat<unsigned_char> *)local_e8,
                                                                r_3 + -2,c_3 + -1);
                                            if (*puVar5 == '\0') {
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3 + -2,c_3 + 2);
                                              uVar4 = *puVar6;
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3 + -2);
                                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                              puVar6 = (uint *)MemMat<int>::operator()
                                                                         ((MemMat<int> *)local_220,
                                                                          r_3,c_3);
                                              *puVar6 = uVar4;
                                            }
                                            else {
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3 + -2,
                                                                  c_3 + 2);
                                              iVar1 = *piVar7;
                                              piVar7 = MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_3,c_3);
                                              *piVar7 = iVar1;
                                            }
                                          }
                                        }
                                      }
                                      goto LAB_001a5869;
                                    }
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                                    *piVar7 = iVar1;
                                  } while( true );
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -2,
                                                    c_3 + 1);
                                if (*puVar5 == '\0') {
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3 + -2,
                                                              c_3 + 2);
                                  uVar4 = *puVar6;
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3 + -2)
                                  ;
                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_3,c_3);
                                  *puVar6 = uVar4;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                                  ;
                                  *piVar7 = iVar1;
                                }
                              }
                            } while( true );
                          }
LAB_001a7280:
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
                          if (*puVar5 != '\0') {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + 1);
                            if (*puVar5 != '\0') goto LAB_001a72f4;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                            if (*puVar5 != '\0') goto LAB_001a73e8;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                            uVar4 = *puVar6;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                            *puVar6 = uVar4;
                            goto LAB_001a5869;
                          }
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                          if (*puVar5 != '\0') goto LAB_001a760f;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                          *piVar7 = iVar1;
                          goto LAB_001a4a7f;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
                        if (*puVar5 == '\0') goto LAB_001a2d20;
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                        if (*puVar5 != '\0') {
LAB_001a718f:
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1);
                          if (*puVar5 == '\0') {
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3 + -2,c_3);
                            uVar4 = *puVar6;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3 + -2);
                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_3,c_3);
                            *puVar6 = uVar4;
                          }
                          else {
LAB_001a5e60:
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                            if (*puVar5 == '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
                              if (*puVar5 == '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3 + -2);
                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_3,c_3);
                                *puVar6 = uVar4;
                              }
                              else {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3 + -2,c_3);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                                *piVar7 = iVar1;
                              }
                            }
                            else {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3 + -2,c_3);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                              *piVar7 = iVar1;
                            }
                          }
                          goto LAB_001a7a7f;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                        if (*puVar5 != '\0') goto LAB_001a7280;
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                          *piVar7 = iVar1;
                          goto LAB_001a6f1e;
                        }
LAB_001a778b:
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                          ;
                          *puVar6 = uVar4;
                        }
                        else {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                          *piVar7 = iVar1;
                        }
                      } while( true );
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
                    if (*puVar5 != '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                      if (*puVar5 != '\0') goto LAB_001a2e45;
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                      if (*puVar5 == '\0') {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                        goto LAB_001a5869;
                      }
                      goto LAB_001a3646;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                    if (*puVar5 != '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                      goto LAB_001a4ff3;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                    if (*puVar5 == '\0') {
                      uVar4 = TTA::MemNewLabel();
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                    goto LAB_001a4a7f;
                  }
                  if (img.accesses_._88_4_ + -2 < c_3) {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                    if (*puVar5 == '\0') goto LAB_001a8b13;
                  }
                  else {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                    if (*puVar5 == '\0') goto LAB_001a99c1;
LAB_001a9b59:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                    if (*puVar5 != '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                      if (*puVar5 == '\0') {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                        if (*puVar5 != '\0') goto LAB_001a9c45;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *piVar7 = iVar1;
                      }
                      goto LAB_001ab6d8;
                    }
                  }
LAB_001a8bcf:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                  if (*puVar5 == '\0') {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                    if (*puVar5 == '\0') {
                      uVar4 = TTA::MemNewLabel();
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                  }
                  goto LAB_001ab6d8;
                }
                uVar4 = TTA::MemNewLabel();
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
                c_3 = c_3 + 2;
                if (c_3 < img.accesses_._88_4_ + -2) {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                  if (*puVar5 != '\0') goto LAB_001a3b16;
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                  if (*puVar5 == '\0') goto LAB_001a320f;
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                  if (*puVar5 != '\0') goto LAB_001a471a;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                  goto LAB_001a657c;
                }
                if (img.accesses_._88_4_ + -2 < c_3) {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                  if (*puVar5 == '\0') goto LAB_001a8eec;
LAB_001a8d36:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                  if (*puVar5 != '\0') {
                    puVar6 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                    uVar4 = *puVar6;
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *puVar6 = uVar4;
                    goto LAB_001ab6d8;
                  }
                }
                else {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3);
                  if (*puVar5 != '\0') {
LAB_001a9dca:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                    if (*puVar5 == '\0') goto LAB_001a8d36;
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                    if (*puVar5 == '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + -1);
                      if (*puVar5 == '\0') {
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3 + -2,c_3);
                        uVar4 = *puVar6;
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_3,c_3 + -2);
                        uVar4 = TTA::MemMerge(uVar4,*puVar6);
                        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                        *puVar6 = uVar4;
                      }
                      else {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                          ;
                          *puVar6 = uVar4;
                        }
                        else {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3 + -2,c_3);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_3,c_3 + -2);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3)
                          ;
                          *puVar6 = uVar4;
                        }
                      }
                    }
                    else {
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3 + -2,c_3);
                      uVar4 = *puVar6;
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_3,c_3 + -2);
                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                      *puVar6 = uVar4;
                    }
                    goto LAB_001ab6d8;
                  }
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
                  if (*puVar5 == '\0') goto LAB_001a9a5e;
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *piVar7 = iVar1;
                    goto LAB_001ab6d8;
                  }
LAB_001aa142:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
                  if (*puVar5 != '\0') {
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                    uVar4 = *puVar6;
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                    *puVar6 = uVar4;
                    goto LAB_001ab6d8;
                  }
                }
LAB_001a8df2:
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *piVar7 = iVar1;
                }
                else {
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                  *puVar6 = uVar4;
                }
                goto LAB_001ab6d8;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
              if (*puVar5 != '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_001a5dbd;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
              if (*puVar5 != '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_001a5869;
              }
              uVar4 = TTA::MemNewLabel();
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *puVar6 = uVar4;
            } while( true );
          }
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3 + -1)
          ;
          if (*puVar5 != '\0') goto LAB_001a5e26;
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + -1);
          if (*puVar5 != '\0') goto LAB_001a5e26;
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
          if (*puVar5 == '\0') {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_001a6f1e;
              }
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
              goto LAB_001a70b6;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
            if (*puVar5 != '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
              if (*puVar5 != '\0') goto LAB_001a2e45;
LAB_001a3646:
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + 1);
              if (*puVar5 == '\0') {
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2)
                ;
                uVar4 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *puVar6 = uVar4;
                goto LAB_001a5869;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
              if (*puVar5 != '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
                *piVar7 = iVar1;
                goto LAB_001a5869;
              }
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
              uVar4 = *puVar6;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
              uVar4 = TTA::MemMerge(uVar4,*puVar6);
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *puVar6 = uVar4;
              goto LAB_001a5869;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
            if (*puVar5 != '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
              goto LAB_001a4ff3;
            }
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *piVar7 = iVar1;
            goto LAB_001a4a7f;
          }
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3)
          ;
          if (*puVar5 == '\0') {
LAB_001a3421:
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3);
            if (*puVar5 == '\0') {
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + -2);
              uVar4 = *puVar6;
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              uVar4 = TTA::MemMerge(uVar4,*puVar6);
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *puVar6 = uVar4;
            }
            else {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = iVar1;
            }
          }
          else {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
            iVar1 = *piVar7;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *piVar7 = iVar1;
          }
        } while( true );
      }
      if (img.accesses_._88_4_ + -2 < 0) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,0);
        if (*puVar5 == '\0') {
LAB_001a8b13:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *piVar7 = 0;
          }
          else {
            uVar4 = TTA::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *puVar6 = uVar4;
          }
          goto LAB_001ab6d8;
        }
LAB_001a8a68:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
        if (*puVar5 == '\0') {
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *puVar6 = uVar4;
        }
        else {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *piVar7 = iVar1;
        }
      }
      else {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,0);
        if (*puVar5 == '\0') {
LAB_001a99c1:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3);
          if (*puVar5 == '\0') {
LAB_001a9a5e:
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
            if (*puVar5 != '\0') goto LAB_001a993c;
LAB_001a9a97:
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3 + 1,c_3 + 1);
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *piVar7 = 0;
            }
            else {
              uVar4 = TTA::MemNewLabel();
              puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
              *puVar6 = uVar4;
            }
          }
          else {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
            if (*puVar5 != '\0') goto LAB_001a993c;
            uVar4 = TTA::MemNewLabel();
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
            *puVar6 = uVar4;
          }
        }
        else {
LAB_001a993c:
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
          if (*puVar5 == '\0') goto LAB_001a8a68;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
          *piVar7 = iVar1;
        }
      }
LAB_001ab6d8:
    }
    if ((int)img.accesses_._92_4_ % 2 == 1) {
      r_4 = img.accesses_._92_4_ + -1;
      c_4 = -2;
LAB_001ab716:
      c_4 = c_4 + 2;
      if (c_4 < img.accesses_._88_4_ + -2) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4);
        if (*puVar5 == '\0') goto LAB_001abb49;
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
        if (*puVar5 != '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *piVar7 = iVar1;
LAB_001ad77f:
          do {
            c_4 = c_4 + 2;
            if (img.accesses_._88_4_ + -2 <= c_4) {
              if (img.accesses_._88_4_ + -2 < c_4) {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                if (*puVar5 == '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                  *piVar7 = 0;
                  goto LAB_001af423;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + -1);
                if (*puVar5 != '\0') {
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                  *piVar7 = iVar1;
                  goto LAB_001af423;
                }
              }
              else {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                if (*puVar5 == '\0') goto LAB_001ae5ab;
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + -1);
                if (*puVar5 != '\0') {
LAB_001aeed7:
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *piVar7 = iVar1;
                  }
                  else {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                    if (*puVar5 == '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                      if (*puVar5 == '\0') {
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4 + -2,c_4);
                        uVar4 = *puVar6;
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                        uVar4 = TTA::MemMerge(uVar4,*puVar6);
                        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *puVar6 = uVar4;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *piVar7 = iVar1;
                      }
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                    }
                  }
                  goto LAB_001af423;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                if (*puVar5 != '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                  if (*puVar5 == '\0') {
LAB_001ae727:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                    if (*puVar5 == '\0') {
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                      uVar4 = *puVar6;
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4);
                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *piVar7 = iVar1;
                  }
                  goto LAB_001af423;
                }
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
              goto LAB_001af423;
            }
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4);
            if (*puVar5 == '\0') goto LAB_001abb49;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + -1);
            if (*puVar5 != '\0') goto LAB_001ad297;
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
            if (*puVar5 == '\0') {
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
              if (*puVar5 != '\0') {
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                if (*puVar5 == '\0') {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                  if (*puVar5 == '\0') {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *piVar7 = iVar1;
                    goto LAB_001ac3fd;
                  }
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                  iVar1 = *piVar7;
                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                  *piVar7 = iVar1;
                  goto LAB_001ac821;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                if (*puVar5 != '\0') goto LAB_001ab8a2;
LAB_001abf96:
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                if (*puVar5 == '\0') {
                  puVar6 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                  uVar4 = *puVar6;
                  puVar6 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                  puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                  *puVar6 = uVar4;
                }
                else {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                  if (*puVar5 == '\0') {
                    puVar6 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                    uVar4 = *puVar6;
                    puVar6 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                    uVar4 = TTA::MemMerge(uVar4,*puVar6);
                    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *puVar6 = uVar4;
                  }
                  else {
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                    iVar1 = *piVar7;
                    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                    *piVar7 = iVar1;
                  }
                }
LAB_001acdf3:
                do {
                  c_4 = c_4 + 2;
                  if (img.accesses_._88_4_ + -2 <= c_4) {
                    if (img.accesses_._88_4_ + -2 < c_4) {
LAB_001ae2c7:
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                      if (*puVar5 == '\0') {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *piVar7 = 0;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *piVar7 = iVar1;
                      }
                    }
                    else {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                      if (*puVar5 == '\0') {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = 0;
                        }
                        else {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                        }
                      }
                      else {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                        }
                        else {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                        }
                      }
                    }
                    goto LAB_001af423;
                  }
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                  if (*puVar5 == '\0') {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = 0;
                      goto LAB_001abc1e;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                    if (*puVar5 != '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                      goto LAB_001ad22e;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                      goto LAB_001ac821;
                    }
LAB_001ab8a2:
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                    if (*puVar5 == '\0') {
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4);
                      uVar4 = *puVar6;
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                    }
                  }
                  else {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                    if (*puVar5 != '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                      goto LAB_001ad77f;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                      goto LAB_001ab716;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                    if (*puVar5 == '\0') {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
LAB_001adb06:
                      c_4 = c_4 + 2;
                      if (img.accesses_._88_4_ + -2 <= c_4) {
                        if (img.accesses_._88_4_ + -2 < c_4) goto LAB_001ae2c7;
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                        if (*puVar5 == '\0') {
LAB_001ae9a4:
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                          if (*puVar5 == '\0') {
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                            *piVar7 = 0;
                          }
                          else {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                            if (*puVar5 == '\0') {
                              uVar4 = TTA::MemNewLabel();
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                            }
                            else {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = iVar1;
                            }
                          }
                        }
                        else {
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                          if (*puVar5 == '\0') {
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                            iVar1 = *piVar7;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                            *piVar7 = iVar1;
                          }
                          else {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                            if (*puVar5 == '\0') {
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                            }
                            else {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                  c_4 + -2);
                              if (*puVar5 == '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4);
                                *puVar6 = uVar4;
                              }
                              else {
LAB_001aeb4c:
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -2,
                                                    c_4 + -1);
                                if (*puVar5 == '\0') {
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_4 + -2,
                                                              c_4 + -2);
                                  uVar4 = *puVar6;
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_4 + -2,c_4)
                                  ;
                                  uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                  puVar6 = (uint *)MemMat<int>::operator()
                                                             ((MemMat<int> *)local_220,r_4,c_4);
                                  *puVar6 = uVar4;
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                                  ;
                                  *piVar7 = iVar1;
                                }
                              }
                            }
                          }
                        }
                        goto LAB_001af423;
                      }
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                      if (*puVar5 == '\0') {
                        do {
                          while( true ) {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                            if (*puVar5 == '\0') {
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = 0;
                              goto LAB_001abc1e;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                            if (*puVar5 != '\0') break;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                            if (*puVar5 != '\0') {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = iVar1;
                              goto LAB_001acdf3;
                            }
                            uVar4 = TTA::MemNewLabel();
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                            *puVar6 = uVar4;
LAB_001ac3fd:
                            c_4 = c_4 + 2;
                            if (img.accesses_._88_4_ + -2 <= c_4) {
                              if (img.accesses_._88_4_ + -2 < c_4) goto LAB_001ae2c7;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                              if (*puVar5 == '\0') goto LAB_001ae9a4;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1
                                                 );
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                              }
                              else {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4);
                                *puVar6 = uVar4;
                              }
                              goto LAB_001af423;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                            if (*puVar5 != '\0') {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1
                                                 );
                              if (*puVar5 != '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4);
                                *puVar6 = uVar4;
                                goto LAB_001ad77f;
                              }
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                                goto LAB_001ab716;
                              }
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2
                                                 );
                              if (*puVar5 == '\0') {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                                goto LAB_001adb06;
                              }
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2)
                              ;
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                              goto LAB_001acdf3;
                            }
                          }
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
LAB_001ad22e:
                          while( true ) {
                            c_4 = c_4 + 2;
                            if (img.accesses_._88_4_ + -2 <= c_4) {
                              if (img.accesses_._88_4_ + -2 < c_4) goto LAB_001ae2c7;
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                              if (*puVar5 == '\0') goto LAB_001ae5ab;
                              goto LAB_001aeed7;
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                            if (*puVar5 != '\0') goto LAB_001ad297;
LAB_001abb49:
                            while (puVar5 = MemMat<unsigned_char>::operator()
                                                      ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1
                                                      ), *puVar5 == '\0') {
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = 0;
LAB_001abc1e:
                              c_4 = c_4 + 2;
                              if (img.accesses_._88_4_ + -2 <= c_4) {
                                if (img.accesses_._88_4_ + -2 < c_4) {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                                  if (*puVar5 == '\0') {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = 0;
                                    goto LAB_001af423;
                                  }
                                }
                                else {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                                  if (*puVar5 == '\0') goto LAB_001ae5ab;
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                      c_4 + 1);
                                  if (*puVar5 != '\0') {
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                        c_4);
                                    if (*puVar5 == '\0') {
                                      puVar5 = MemMat<unsigned_char>::operator()
                                                         ((MemMat<unsigned_char> *)local_e8,r_4 + -1
                                                          ,c_4 + -1);
                                      if (*puVar5 != '\0') goto LAB_001ae727;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                                      *piVar7 = iVar1;
                                    }
                                    else {
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                                      *piVar7 = iVar1;
                                    }
                                    goto LAB_001af423;
                                  }
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                      c_4 + -1);
                                  if (*puVar5 == '\0') {
                                    uVar4 = TTA::MemNewLabel();
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_4,c_4);
                                    *puVar6 = uVar4;
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                }
                                else {
                                  piVar7 = MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                  iVar1 = *piVar7;
                                  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                                  ;
                                  *piVar7 = iVar1;
                                }
                                goto LAB_001af423;
                              }
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                              if (*puVar5 != '\0') {
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                    c_4 + 1);
                                if (*puVar5 != '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4
                                                     );
                                  if (*puVar5 == '\0') {
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                        c_4 + -1);
                                    if (*puVar5 != '\0') goto LAB_001abd71;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                  goto LAB_001ad77f;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4
                                                     );
                                  if (*puVar5 == '\0') {
                                    puVar5 = MemMat<unsigned_char>::operator()
                                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                        c_4 + -1);
                                    if (*puVar5 == '\0') {
                                      uVar4 = TTA::MemNewLabel();
                                      puVar6 = (uint *)MemMat<int>::operator()
                                                                 ((MemMat<int> *)local_220,r_4,c_4);
                                      *puVar6 = uVar4;
                                    }
                                    else {
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2
                                                         );
                                      iVar1 = *piVar7;
                                      piVar7 = MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                                      *piVar7 = iVar1;
                                    }
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                  goto LAB_001ab716;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                    c_4 + 2);
                                if (*puVar5 == '\0') {
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4
                                                     );
                                  if (*puVar5 != '\0') {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                    goto LAB_001ac821;
                                  }
                                  puVar5 = MemMat<unsigned_char>::operator()
                                                     ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                      c_4 + -1);
                                  if (*puVar5 == '\0') {
                                    uVar4 = TTA::MemNewLabel();
                                    puVar6 = (uint *)MemMat<int>::operator()
                                                               ((MemMat<int> *)local_220,r_4,c_4);
                                    *puVar6 = uVar4;
                                  }
                                  else {
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                                    iVar1 = *piVar7;
                                    piVar7 = MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                                    *piVar7 = iVar1;
                                  }
                                  goto LAB_001ac3fd;
                                }
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                                if (*puVar5 != '\0') goto LAB_001ab8a2;
                                puVar5 = MemMat<unsigned_char>::operator()
                                                   ((MemMat<unsigned_char> *)local_e8,r_4 + -1,
                                                    c_4 + -1);
                                if (*puVar5 != '\0') goto LAB_001abf96;
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                                goto LAB_001acdf3;
                              }
                            }
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                            if (*puVar5 == '\0') break;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                            iVar1 = *piVar7;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                            *piVar7 = iVar1;
                          }
LAB_001ab831:
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                          if (*puVar5 != '\0') {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                            if (*puVar5 != '\0') goto LAB_001ab8a2;
                            piVar7 = MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                            iVar1 = *piVar7;
                            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                            *piVar7 = iVar1;
                            goto LAB_001acdf3;
                          }
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
                          if (*puVar5 == '\0') {
                            uVar4 = TTA::MemNewLabel();
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                            *puVar6 = uVar4;
                            goto LAB_001ac3fd;
                          }
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
LAB_001ac821:
                          c_4 = c_4 + 2;
                          if (img.accesses_._88_4_ + -2 <= c_4) {
                            if (img.accesses_._88_4_ + -2 < c_4) goto LAB_001ae2c7;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                            if (*puVar5 == '\0') goto LAB_001ae9a4;
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                            if (*puVar5 == '\0') {
                              piVar7 = MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              iVar1 = *piVar7;
                              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                              *piVar7 = iVar1;
                            }
                            else {
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                              if (*puVar5 != '\0') goto LAB_001aeb4c;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                            }
                            goto LAB_001af423;
                          }
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4,c_4);
                        } while (*puVar5 == '\0');
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                        if (*puVar5 != '\0') {
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                          if (*puVar5 != '\0') goto LAB_001ac8f9;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_001ad77f;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                          goto LAB_001ab716;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                          goto LAB_001adb06;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_001acdf3;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_001acdf3;
                        }
                      }
                      else {
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
                        if (*puVar5 != '\0') {
                          puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                          if (*puVar5 == '\0') {
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4 + -2,c_4);
                            uVar4 = *puVar6;
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4 + -2);
                            uVar4 = TTA::MemMerge(uVar4,*puVar6);
                            puVar6 = (uint *)MemMat<int>::operator()
                                                       ((MemMat<int> *)local_220,r_4,c_4);
                            *puVar6 = uVar4;
                          }
                          else {
                            puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + -2)
                            ;
                            if (*puVar5 == '\0') {
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4 + -2,c_4);
                              uVar4 = *puVar6;
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4 + -2);
                              uVar4 = TTA::MemMerge(uVar4,*puVar6);
                              puVar6 = (uint *)MemMat<int>::operator()
                                                         ((MemMat<int> *)local_220,r_4,c_4);
                              *puVar6 = uVar4;
                            }
                            else {
LAB_001ac8f9:
                              puVar5 = MemMat<unsigned_char>::operator()
                                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -2,
                                                  c_4 + -1);
                              if (*puVar5 == '\0') {
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,
                                                            c_4 + -2);
                                uVar4 = *puVar6;
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                                puVar6 = (uint *)MemMat<int>::operator()
                                                           ((MemMat<int> *)local_220,r_4,c_4);
                                *puVar6 = uVar4;
                              }
                              else {
                                piVar7 = MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4 + -2,c_4);
                                iVar1 = *piVar7;
                                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                                *piVar7 = iVar1;
                              }
                            }
                          }
                          goto LAB_001ad77f;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                          goto LAB_001ab716;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
                        if (*puVar5 == '\0') {
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
                          iVar1 = *piVar7;
                          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                          *piVar7 = iVar1;
                          goto LAB_001adb06;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_001acdf3;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_001acdf3;
                        }
                        puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + -2);
                        if (*puVar5 == '\0') {
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                          uVar4 = *puVar6;
                          puVar6 = (uint *)MemMat<int>::operator()
                                                     ((MemMat<int> *)local_220,r_4,c_4 + -2);
                          uVar4 = TTA::MemMerge(uVar4,*puVar6);
                          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4)
                          ;
                          *puVar6 = uVar4;
                          goto LAB_001acdf3;
                        }
                      }
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + -1);
                      if (*puVar5 == '\0') {
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                        uVar4 = *puVar6;
                        puVar6 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_4,c_4 + -2);
                        uVar4 = TTA::MemMerge(uVar4,*puVar6);
                        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *puVar6 = uVar4;
                      }
                      else {
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                        iVar1 = *piVar7;
                        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                        *piVar7 = iVar1;
                      }
                      goto LAB_001acdf3;
                    }
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
                    if (*puVar5 == '\0') {
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                      uVar4 = *puVar6;
                      puVar6 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_4,c_4 + -2);
                      uVar4 = TTA::MemMerge(uVar4,*puVar6);
                      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *puVar6 = uVar4;
                    }
                    else {
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
                      iVar1 = *piVar7;
                      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                      *piVar7 = iVar1;
                    }
                  }
                } while( true );
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
              if (*puVar5 == '\0') {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + -2);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
              goto LAB_001ab716;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
            if (*puVar5 == '\0') {
LAB_001abd71:
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
              if (*puVar5 == '\0') {
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + -2)
                ;
                uVar4 = *puVar6;
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                uVar4 = TTA::MemMerge(uVar4,*puVar6);
                puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *puVar6 = uVar4;
              }
              else {
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
                iVar1 = *piVar7;
                piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
                *piVar7 = iVar1;
              }
            }
            else {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
              iVar1 = *piVar7;
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
              *piVar7 = iVar1;
            }
          } while( true );
        }
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
        if (*puVar5 != '\0') goto LAB_001ab831;
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
        if (*puVar5 == '\0') {
          uVar4 = TTA::MemNewLabel();
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *puVar6 = uVar4;
        }
        else {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *piVar7 = iVar1;
        }
        goto LAB_001ab716;
      }
      if (img.accesses_._88_4_ + -2 < c_4) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4);
        if (*puVar5 == '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *piVar7 = 0;
          goto LAB_001af423;
        }
      }
      else {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4);
        if (*puVar5 == '\0') {
LAB_001ae5ab:
          puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
            *piVar7 = 0;
            goto LAB_001af423;
          }
        }
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
        if (*puVar5 != '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
          iVar1 = *piVar7;
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
          *piVar7 = iVar1;
          goto LAB_001af423;
        }
      }
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
      if (*puVar5 == '\0') {
        uVar4 = TTA::MemNewLabel();
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *puVar6 = uVar4;
      }
      else {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
        iVar1 = *piVar7;
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *piVar7 = iVar1;
      }
    }
  }
LAB_001af423:
  uVar4 = TTA::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
  for (iLabel = 0; iLabel < (int)img.accesses_._92_4_; iLabel = iLabel + 2) {
    for (local_250 = 0; local_250 < (int)img.accesses_._88_4_; local_250 = local_250 + 2) {
      puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250);
      local_254 = *puVar6;
      if ((int)local_254 < 1) {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250);
        *piVar7 = 0;
        if (local_250 + 1 < (int)img.accesses_._88_4_) {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250 + 1);
          *piVar7 = 0;
          if (iLabel + 1 < (int)img.accesses_._92_4_) {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
            *piVar7 = 0;
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250 + 1);
            *piVar7 = 0;
          }
        }
        else if (iLabel + 1 < (int)img.accesses_._92_4_) {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
          *piVar7 = 0;
        }
      }
      else {
        local_254 = TTA::MemGetLabel(local_254);
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e8,iLabel,local_250);
        uVar4 = local_254;
        if (*puVar5 == '\0') {
          piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250);
          *piVar7 = 0;
        }
        else {
          puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250);
          *puVar6 = uVar4;
        }
        if (local_250 + 1 < (int)img.accesses_._88_4_) {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,iLabel,local_250 + 1);
          uVar4 = local_254;
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250 + 1);
            *piVar7 = 0;
          }
          else {
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_250 + 1);
            *puVar6 = uVar4;
          }
          if (iLabel + 1 < (int)img.accesses_._92_4_) {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,iLabel + 1,local_250);
            uVar4 = local_254;
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
              *piVar7 = 0;
            }
            else {
              puVar6 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_220,iLabel + 1,local_250);
              *puVar6 = uVar4;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,iLabel + 1,local_250 + 1);
            uVar4 = local_254;
            if (*puVar5 == '\0') {
              piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250 + 1);
              *piVar7 = 0;
            }
            else {
              puVar6 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_220,iLabel + 1,local_250 + 1);
              *puVar6 = uVar4;
            }
          }
        }
        else if (iLabel + 1 < (int)img.accesses_._92_4_) {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,iLabel + 1,local_250);
          uVar4 = local_254;
          if (*puVar5 == '\0') {
            piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
            *piVar7 = 0;
          }
          else {
            puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_250);
            *puVar6 = uVar4;
          }
        }
      }
    }
  }
  local_278 = 0;
  std::allocator<unsigned_long>::allocator(&local_279);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_270,4,&local_278,&local_279);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(accesses,&local_270);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_270);
  std::allocator<unsigned_long>::~allocator(&local_279);
  dVar9 = MemMat<unsigned_char>::GetTotalAccesses((MemMat<unsigned_char> *)local_e8);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,0);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_220);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,1);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = TTA::MemTotalAccesses();
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,2);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  MemMat<int>::GetImage(&local_2e0,(MemMat<int> *)local_220);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_2e0);
  cv::Mat_<int>::~Mat_(&local_2e0);
  TTA::MemDealloc();
  MemMat<int>::~MemMat((MemMat<int> *)local_220);
  MemMat<unsigned_char>::~MemMat((MemMat<unsigned_char> *)local_e8);
  return;
LAB_001a320f:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3,c_3 + 1);
  if (*puVar5 == '\0') goto LAB_001a3248;
LAB_001a315a:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 1);
  if (*puVar5 != '\0') {
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
    iVar1 = *piVar7;
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
    *piVar7 = iVar1;
    goto LAB_001a5dbd;
  }
LAB_001a2dd4:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3 + 2);
  if (*puVar5 != '\0') {
    puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
    if (*puVar5 != '\0') goto LAB_001a2e45;
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
    iVar1 = *piVar7;
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
    *piVar7 = iVar1;
    goto LAB_001a5869;
  }
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -1,c_3);
  if (*puVar5 == '\0') {
    uVar4 = TTA::MemNewLabel();
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
    *puVar6 = uVar4;
    goto LAB_001a4a7f;
  }
  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3);
  iVar1 = *piVar7;
  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
  *piVar7 = iVar1;
  goto LAB_001a4ff3;
LAB_001a72f4:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_3 + -2,c_3 + -1);
  if (*puVar5 == '\0') {
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3 + -2,c_3 + 2);
    uVar4 = *puVar6;
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3 + -2);
    uVar4 = TTA::MemMerge(uVar4,*puVar6);
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_3,c_3);
    *puVar6 = uVar4;
    goto LAB_001a5869;
  }
  goto LAB_001a6082;
LAB_001ad297:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 1);
  if (*puVar5 != '\0') {
    puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
    if (*puVar5 == '\0') {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
      if (*puVar5 == '\0') {
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
        uVar4 = *puVar6;
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
        uVar4 = TTA::MemMerge(uVar4,*puVar6);
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *puVar6 = uVar4;
      }
      else {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
        iVar1 = *piVar7;
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *piVar7 = iVar1;
      }
    }
    else {
      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4);
      iVar1 = *piVar7;
      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
      *piVar7 = iVar1;
    }
    goto LAB_001ad77f;
  }
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4,c_4 + 1);
  if (*puVar5 == '\0') {
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
    iVar1 = *piVar7;
    piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
    *piVar7 = iVar1;
    goto LAB_001ab716;
  }
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4 + 2);
  if (*puVar5 != '\0') goto code_r0x001ad4b2;
  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
  iVar1 = *piVar7;
  piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
  *piVar7 = iVar1;
  goto LAB_001adb06;
code_r0x001ad4b2:
  puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4 + 1);
  if (*puVar5 == '\0') {
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
    uVar4 = *puVar6;
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
    uVar4 = TTA::MemMerge(uVar4,*puVar6);
    puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
    *puVar6 = uVar4;
  }
  else {
    puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -1,c_4);
    if (*puVar5 == '\0') {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_4 + -2,c_4);
      if (*puVar5 == '\0') {
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
        uVar4 = *puVar6;
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4 + -2);
        uVar4 = TTA::MemMerge(uVar4,*puVar6);
        puVar6 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *puVar6 = uVar4;
      }
      else {
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
        iVar1 = *piVar7;
        piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
        *piVar7 = iVar1;
      }
    }
    else {
      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4 + -2,c_4 + 2);
      iVar1 = *piVar7;
      piVar7 = MemMat<int>::operator()((MemMat<int> *)local_220,r_4,c_4);
      *piVar7 = iVar1;
    }
  }
  goto LAB_001acdf3;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
	{
		const int h = img_.rows;
		const int w = img_.cols;

		LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
		LabelsSolver::MemSetup();

		//Data structure for memory test
		MemMat<unsigned char> img(img_);
		MemMat<int> img_labels(img_.size(), 0);

		// We work with 2x2 blocks
		// +-+-+-+
		// |P|Q|R|
		// +-+-+-+
		// |S|X|
		// +-+-+

		// The pixels are named as follows
		// +---+---+---+
		// |a b|c d|e f|
		// |g h|i j|k l|
		// +---+---+---+
		// |m n|o p|
		// |q r|s t|
		// +---+---+

		// Pixels a, f, l, q are not needed, since we need to understand the
		// the connectivity between these blocks and those pixels only metter
		// when considering the outer connectivities

		// A bunch of defines used to check if the pixels are foreground,
		// without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

				// Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
				// Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
				//Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
				// Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
				// Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
				// Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
				// Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
				//Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
				// Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
				// Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
				// Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
				// Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
				// Action 13: not used
#define ACTION_13 
				// Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
				//Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
				//Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


		if (h == 1) {
			// Single line
			int r = 0;
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				int r = 0;
				int c = -2;
#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < h - (h % 2); r += 2) {
				int c = -2;
				goto tree_0;
#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case that the rows are odd)
			if ((h % 2) == 1)
			{
				int r = h - 1;
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}

		n_labels_ = LabelsSolver::MemFlatten();

		// Second scan
		for (int r = 0; r < h; r += 2) {
			for (int c = 0; c < w; c += 2) {
				int iLabel = img_labels(r, c);
				if (iLabel > 0) {
					iLabel = LabelsSolver::MemGetLabel(iLabel);
					if (img(r, c) > 0)
						img_labels(r, c) = iLabel;
					else
						img_labels(r, c) = 0;
					if (c + 1 < w) {
						if (img(r, c + 1) > 0)
							img_labels(r, c + 1) = iLabel;
						else
							img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							if (img(r + 1, c) > 0)
								img_labels(r + 1, c) = iLabel;
							else
								img_labels(r + 1, c) = 0;
							if (img(r + 1, c + 1) > 0)
								img_labels(r + 1, c + 1) = iLabel;
							else
								img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						if (img(r + 1, c) > 0)
							img_labels(r + 1, c) = iLabel;
						else
							img_labels(r + 1, c) = 0;
					}
				}
				else {
					img_labels(r, c) = 0;
					if (c + 1 < w) {
						img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							img_labels(r + 1, c) = 0;
							img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						img_labels(r + 1, c) = 0;
					}
				}
			}
		}

		// Store total accesses in the output vector 'accesses'
		accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

		accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
		accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
		accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

		img_labels_ = img_labels.GetImage();

		LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
	}